

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_auth_act(connectdata *conn)

{
  undefined1 *puVar1;
  undefined4 uVar2;
  uint uVar3;
  Curl_HttpReq CVar4;
  Curl_easy *data;
  _Bool _Var5;
  _Bool _Var6;
  CURLcode CVar7;
  int iVar8;
  char *pcVar9;
  
  data = conn->data;
  iVar8 = (data->req).httpcode;
  if (iVar8 - 100U < 100) {
    return CURLE_OK;
  }
  if (((data->state).field_0x4e4 & 0x20) != 0) {
    if (((data->set).field_0x87a & 0x10) == 0) {
      return CURLE_OK;
    }
    return CURLE_HTTP_RETURNED_ERROR;
  }
  uVar2 = *(undefined4 *)&(conn->bits).field_0x4;
  if (((char)uVar2 < '\0' || conn->oauth_bearer != (char *)0x0) &&
     ((iVar8 == 0x191 || (iVar8 < 300 && (short)uVar2 < 0)))) {
    _Var5 = pickoneauth(&(data->state).authhost,
                        -(ulong)(conn->oauth_bearer != (char *)0x0) | 0xffffffffffffffbf);
    if (!_Var5) {
      puVar1 = &(data->state).field_0x4e4;
      *puVar1 = *puVar1 | 0x20;
    }
    if (((data->state).authhost.picked == 8) && (0xb < conn->httpversion)) {
      Curl_infof(data,"Forcing HTTP/1.1 for NTLM");
      Curl_conncontrol(conn,1);
      (conn->data->set).httpversion = 2;
    }
  }
  else {
    _Var5 = false;
  }
  uVar3 = *(uint *)&(conn->bits).field_0x4;
  if (((uVar3 >> 8 & 1) == 0) ||
     ((iVar8 = (data->req).httpcode, iVar8 != 0x197 && (299 < iVar8 || -1 < (short)uVar3)))) {
LAB_003edb2d:
    if (_Var5 == false) {
      if (((((data->req).httpcode < 300) && (((data->state).authhost.field_0x18 & 1) == 0)) &&
          (((conn->bits).field_0x5 & 0x80) != 0)) &&
         ((CVar4 = (data->set).httpreq, CVar4 != HTTPREQ_GET && (CVar4 != HTTPREQ_HEAD)))) {
        pcVar9 = (*Curl_cstrdup)((data->change).url);
        (data->req).newurl = pcVar9;
        if (pcVar9 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        puVar1 = &(data->state).authhost.field_0x18;
        *puVar1 = *puVar1 | 1;
      }
      goto LAB_003edbe6;
    }
  }
  else {
    _Var6 = pickoneauth(&(data->state).authproxy,0xffffffffffffffbf);
    if (!_Var6) {
      puVar1 = &(data->state).field_0x4e4;
      *puVar1 = *puVar1 | 0x20;
      goto LAB_003edb2d;
    }
  }
  CVar4 = (data->set).httpreq;
  if (((CVar4 != HTTPREQ_GET) && (CVar4 != HTTPREQ_HEAD)) &&
     ((((conn->bits).field_0x6 & 1) == 0 && (CVar7 = http_perhapsrewind(conn), CVar7 != CURLE_OK))))
  {
    return CVar7;
  }
  (*Curl_cfree)((data->req).newurl);
  (data->req).newurl = (char *)0x0;
  pcVar9 = (*Curl_cstrdup)((data->change).url);
  (data->req).newurl = pcVar9;
  if (pcVar9 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
LAB_003edbe6:
  iVar8 = http_should_fail(conn);
  if (iVar8 == 0) {
    CVar7 = CURLE_OK;
  }
  else {
    Curl_failf(data,"The requested URL returned error: %d",(ulong)(uint)(data->req).httpcode);
    CVar7 = CURLE_HTTP_RETURNED_ERROR;
  }
  return CVar7;
}

Assistant:

CURLcode Curl_http_auth_act(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  bool pickhost = FALSE;
  bool pickproxy = FALSE;
  CURLcode result = CURLE_OK;
  unsigned long authmask = ~0ul;

  if(!conn->oauth_bearer)
    authmask &= (unsigned long)~CURLAUTH_BEARER;

  if(100 <= data->req.httpcode && 199 >= data->req.httpcode)
    /* this is a transient response code, ignore */
    return CURLE_OK;

  if(data->state.authproblem)
    return data->set.http_fail_on_error?CURLE_HTTP_RETURNED_ERROR:CURLE_OK;

  if((conn->bits.user_passwd || conn->oauth_bearer) &&
     ((data->req.httpcode == 401) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickhost = pickoneauth(&data->state.authhost, authmask);
    if(!pickhost)
      data->state.authproblem = TRUE;
    if(data->state.authhost.picked == CURLAUTH_NTLM &&
       conn->httpversion > 11) {
      infof(data, "Forcing HTTP/1.1 for NTLM");
      connclose(conn, "Force HTTP/1.1 connection");
      conn->data->set.httpversion = CURL_HTTP_VERSION_1_1;
    }
  }
  if(conn->bits.proxy_user_passwd &&
     ((data->req.httpcode == 407) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickproxy = pickoneauth(&data->state.authproxy,
                            authmask & ~CURLAUTH_BEARER);
    if(!pickproxy)
      data->state.authproblem = TRUE;
  }

  if(pickhost || pickproxy) {
    if((data->set.httpreq != HTTPREQ_GET) &&
       (data->set.httpreq != HTTPREQ_HEAD) &&
       !conn->bits.rewindaftersend) {
      result = http_perhapsrewind(conn);
      if(result)
        return result;
    }
    /* In case this is GSS auth, the newurl field is already allocated so
       we must make sure to free it before allocating a new one. As figured
       out in bug #2284386 */
    Curl_safefree(data->req.newurl);
    data->req.newurl = strdup(data->change.url); /* clone URL */
    if(!data->req.newurl)
      return CURLE_OUT_OF_MEMORY;
  }
  else if((data->req.httpcode < 300) &&
          (!data->state.authhost.done) &&
          conn->bits.authneg) {
    /* no (known) authentication available,
       authentication is not "done" yet and
       no authentication seems to be required and
       we didn't try HEAD or GET */
    if((data->set.httpreq != HTTPREQ_GET) &&
       (data->set.httpreq != HTTPREQ_HEAD)) {
      data->req.newurl = strdup(data->change.url); /* clone URL */
      if(!data->req.newurl)
        return CURLE_OUT_OF_MEMORY;
      data->state.authhost.done = TRUE;
    }
  }
  if(http_should_fail(conn)) {
    failf(data, "The requested URL returned error: %d",
          data->req.httpcode);
    result = CURLE_HTTP_RETURNED_ERROR;
  }

  return result;
}